

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O0

int __thiscall audiofft::OouraFFT::init(OouraFFT *this,EVP_PKEY_CTX *ctx)

{
  int nw;
  int *piVar1;
  double *pdVar2;
  EVP_PKEY_CTX *extraout_RAX;
  EVP_PKEY_CTX *pEVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int size4;
  size_t size_local;
  OouraFFT *this_local;
  
  pEVar3 = (EVP_PKEY_CTX *)this->_size;
  if (pEVar3 != ctx) {
    auVar5._8_4_ = (int)((ulong)ctx >> 0x20);
    auVar5._0_8_ = ctx;
    auVar5._12_4_ = 0x45300000;
    dVar4 = sqrt((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)ctx) - 4503599627370496.0));
    std::vector<int,_std::allocator<int>_>::resize(&this->_ip,(long)((int)dVar4 + 2));
    std::vector<double,_std::allocator<double>_>::resize(&this->_w,(ulong)ctx >> 1);
    std::vector<double,_std::allocator<double>_>::resize(&this->_buffer,(size_type)ctx);
    this->_size = (size_t)ctx;
    nw = (int)((long)((ulong)(uint)((int)this->_size >> 0x1f) << 0x20 | this->_size & 0xffffffff) /
              4);
    piVar1 = std::vector<int,_std::allocator<int>_>::data(&this->_ip);
    pdVar2 = std::vector<double,_std::allocator<double>_>::data(&this->_w);
    makewt(this,nw,piVar1,pdVar2);
    piVar1 = std::vector<int,_std::allocator<int>_>::data(&this->_ip);
    pdVar2 = std::vector<double,_std::allocator<double>_>::data(&this->_w);
    makect(this,nw,piVar1,pdVar2 + nw);
    pEVar3 = extraout_RAX;
  }
  return (int)pEVar3;
}

Assistant:

virtual void init(size_t size) override
        {
          if (_size != size)
          {
            _ip.resize(2 + static_cast<int>(std::sqrt(static_cast<double>(size))));
            _w.resize(size / 2);
            _buffer.resize(size);
            _size = size;

            const int size4 = static_cast<int>(_size) / 4;
            makewt(size4, _ip.data(), _w.data());
            makect(size4, _ip.data(), _w.data() + size4);
          }
        }